

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O2

int Cba_ObjDup(Cba_Ntk_t *pNew,Cba_Ntk_t *p,int i)

{
  Cba_ObjType_t Type;
  int iVar1;
  int nFons;
  
  Type = Cba_ObjType(p,i);
  iVar1 = Cba_ObjFinNum(p,i);
  nFons = Cba_ObjFonNum(p,i);
  iVar1 = Cba_ObjAlloc(pNew,Type,iVar1,nFons);
  Cba_ObjSetCopy(p,i,iVar1);
  return iVar1;
}

Assistant:

static inline int Cba_ObjDup( Cba_Ntk_t * pNew, Cba_Ntk_t * p, int i )
{
    int iObj = Cba_ObjAlloc( pNew, Cba_ObjType(p, i), Cba_ObjFinNum(p, i), Cba_ObjFonNum(p, i) );
    Cba_ObjSetCopy( p, i, iObj );
    return iObj;
}